

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

CharSetNode * __thiscall
UnifiedRegex::CharSetLeaf::ClearRange
          (CharSetLeaf *this,ArenaAllocator *allocator,uint level,uint l,uint h)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint uVar4;
  
  if (level != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x2e4,"(level == 0)","level == 0");
    if (!bVar2) goto LAB_00cd8732;
    *puVar3 = 0;
  }
  uVar4 = ~(-1 << ((char)(level << 2) + 8U & 0x1f));
  if (uVar4 < h) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x2e5,"(h <= lim(level))",
                       "The range for clearing provided is invalid for this level.");
    if (!bVar2) goto LAB_00cd8732;
    *puVar3 = 0;
  }
  if (h < l) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x2e6,"(l <= h)","Can\'t clear where lower is bigger than the higher.");
    if (!bVar2) {
LAB_00cd8732:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  else if (uVar4 == h && l == 0) {
    return (CharSetNode *)0x0;
  }
  CharBitvec::ClearRange(&this->vec,l & 0xff,h & 0xff);
  bVar2 = CharBitvec::IsEmpty(&this->vec);
  if (bVar2) {
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,UnifiedRegex::CharSetLeaf>
              (allocator,this);
    return (CharSetNode *)0x0;
  }
  return &this->super_CharSetNode;
}

Assistant:

CharSetNode* CharSetLeaf::ClearRange(ArenaAllocator* allocator, uint level, uint l, uint h)
    {
        Assert(level == 0);
        AssertMsg(h <= lim(level), "The range for clearing provided is invalid for this level.");
        AssertMsg(l <= h, "Can't clear where lower is bigger than the higher.");
        if (l == 0 && h == lim(level))
        {
            return nullptr;
        }

        vec.ClearRange(leafIdx(l), leafIdx(h));

        if (vec.IsEmpty())
        {
            FreeSelf(allocator);
            return nullptr;
        }

        return this;
    }